

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioCOMConstructEXT(FAudio **ppFAudio,uint8_t version)

{
  FAudio *pFVar1;
  FAudioMutex pvVar2;
  
  FAudio_PlatformAddRef();
  pFVar1 = (FAudio *)SDL_malloc(0xe8);
  *ppFAudio = pFVar1;
  SDL_memset(pFVar1,0,0xe8);
  (*ppFAudio)->version = version;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->sourceLock = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->submixLock = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->callbackLock = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->operationLock = pvVar2;
  (*ppFAudio)->pMalloc = SDL_malloc;
  (*ppFAudio)->pFree = SDL_free;
  (*ppFAudio)->pRealloc = SDL_realloc;
  (*ppFAudio)->refcount = 1;
  return 0;
}

Assistant:

uint32_t FAudioCOMConstructEXT(FAudio **ppFAudio, uint8_t version)
{
	return FAudioCOMConstructWithCustomAllocatorEXT(
		ppFAudio,
		version,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}